

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::addCol(Highs *this,double cost,double lower_bound,double upper_bound,HighsInt num_new_nz,
             HighsInt *indices,double *values)

{
  HighsStatus HVar1;
  double cost_local;
  HighsInt starts;
  double upper_bound_local;
  double lower_bound_local;
  
  cost_local = cost;
  upper_bound_local = upper_bound;
  lower_bound_local = lower_bound;
  logHeader(this);
  starts = 0;
  HVar1 = addCols(this,1,&cost_local,&lower_bound_local,&upper_bound_local,num_new_nz,&starts,
                  indices,values);
  return HVar1;
}

Assistant:

HighsStatus Highs::addCol(const double cost, const double lower_bound,
                          const double upper_bound, const HighsInt num_new_nz,
                          const HighsInt* indices, const double* values) {
  this->logHeader();
  HighsInt starts = 0;
  return addCols(1, &cost, &lower_bound, &upper_bound, num_new_nz, &starts,
                 indices, values);
}